

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGLES1Loader(GLADloadproc load)

{
  GLubyte *pGVar1;
  bool local_19;
  GLADloadproc load_local;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    load_local._4_4_ = 0;
  }
  else {
    pGVar1 = (*glad_glGetString)(0x1f02);
    if (pGVar1 == (GLubyte *)0x0) {
      load_local._4_4_ = 0;
    }
    else {
      find_coreGLES1();
      load_GL_VERSION_ES_CM_1_0(load);
      find_extensionsGLES1();
      load_GL_EXT_multi_draw_arrays(load);
      load_GL_NV_fence(load);
      load_GL_OES_single_precision(load);
      load_GL_EXT_blend_minmax(load);
      load_GL_OES_byte_coordinates(load);
      load_GL_OES_query_matrix(load);
      load_GL_OES_fixed_point(load);
      load_GL_NV_fence(load);
      load_GL_OES_vertex_array_object(load);
      load_GL_QCOM_tiled_rendering(load);
      load_GL_EXT_robustness(load);
      load_GL_EXT_multi_draw_arrays(load);
      load_GL_QCOM_driver_control(load);
      load_GL_EXT_multisampled_render_to_texture(load);
      load_GL_APPLE_framebuffer_multisample(load);
      load_GL_APPLE_sync(load);
      load_GL_QCOM_extended_get2(load);
      load_GL_OES_EGL_image(load);
      load_GL_EXT_blend_minmax(load);
      load_GL_EXT_texture_storage(load);
      load_GL_EXT_map_buffer_range(load);
      load_GL_OES_mapbuffer(load);
      load_GL_IMG_multisampled_render_to_texture(load);
      load_GL_APPLE_copy_texture_levels(load);
      load_GL_QCOM_extended_get(load);
      load_GL_EXT_discard_framebuffer(load);
      load_GL_EXT_multi_draw_arrays(load);
      load_GL_OES_single_precision(load);
      load_GL_OES_point_size_array(load);
      load_GL_OES_texture_cube_map(load);
      load_GL_IMG_user_clip_plane(load);
      load_GL_NV_fence(load);
      load_GL_EXT_map_buffer_range(load);
      load_GL_OES_blend_subtract(load);
      load_GL_QCOM_extended_get2(load);
      load_GL_EXT_multisampled_render_to_texture(load);
      load_GL_EXT_discard_framebuffer(load);
      load_GL_OES_fixed_point(load);
      load_GL_OES_matrix_palette(load);
      load_GL_OES_mapbuffer(load);
      load_GL_IMG_multisampled_render_to_texture(load);
      load_GL_APPLE_framebuffer_multisample(load);
      load_GL_APPLE_copy_texture_levels(load);
      load_GL_OES_EGL_image(load);
      load_GL_QCOM_extended_get(load);
      load_GL_OES_query_matrix(load);
      load_GL_QCOM_tiled_rendering(load);
      load_GL_OES_blend_equation_separate(load);
      load_GL_OES_framebuffer_object(load);
      load_GL_EXT_robustness(load);
      load_GL_OES_draw_texture(load);
      load_GL_OES_blend_func_separate(load);
      load_GL_OES_vertex_array_object(load);
      load_GL_EXT_blend_minmax(load);
      load_GL_OES_byte_coordinates(load);
      load_GL_APPLE_sync(load);
      load_GL_EXT_texture_storage(load);
      load_GL_QCOM_driver_control(load);
      local_19 = GLVersion.major != 0 || GLVersion.minor != 0;
      load_local._4_4_ = (uint)local_19;
    }
  }
  return load_local._4_4_;
}

Assistant:

int gladLoadGLES1Loader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGLES1();
	load_GL_VERSION_ES_CM_1_0(load);

	find_extensionsGLES1();
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_NV_fence(load);
	load_GL_OES_single_precision(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_OES_byte_coordinates(load);
	load_GL_OES_query_matrix(load);
	load_GL_OES_fixed_point(load);
	load_GL_NV_fence(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_QCOM_tiled_rendering(load);
	load_GL_EXT_robustness(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_QCOM_driver_control(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_sync(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_OES_EGL_image(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_EXT_texture_storage(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_OES_mapbuffer(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_QCOM_extended_get(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_OES_single_precision(load);
	load_GL_OES_point_size_array(load);
	load_GL_OES_texture_cube_map(load);
	load_GL_IMG_user_clip_plane(load);
	load_GL_NV_fence(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_OES_blend_subtract(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_OES_fixed_point(load);
	load_GL_OES_matrix_palette(load);
	load_GL_OES_mapbuffer(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_OES_EGL_image(load);
	load_GL_QCOM_extended_get(load);
	load_GL_OES_query_matrix(load);
	load_GL_QCOM_tiled_rendering(load);
	load_GL_OES_blend_equation_separate(load);
	load_GL_OES_framebuffer_object(load);
	load_GL_EXT_robustness(load);
	load_GL_OES_draw_texture(load);
	load_GL_OES_blend_func_separate(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_OES_byte_coordinates(load);
	load_GL_APPLE_sync(load);
	load_GL_EXT_texture_storage(load);
	load_GL_QCOM_driver_control(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}